

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_cast_expression.cpp
# Opt level: O1

void __thiscall
duckdb::BoundCastExpression::BoundCastExpression
          (BoundCastExpression *this,ClientContext *context,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child_p,
          LogicalType *target_type_p)

{
  pointer pEVar1;
  DBConfig *this_00;
  CastFunctionSet *this_01;
  pointer *__ptr;
  LogicalType LStack_48;
  GetCastFunctionInput local_30;
  
  LogicalType::LogicalType(&LStack_48,target_type_p);
  Expression::Expression(&this->super_Expression,OPERATOR_CAST,BOUND_CAST,&LStack_48);
  LogicalType::~LogicalType(&LStack_48);
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)&PTR__BoundCastExpression_02477fe8;
  (this->child).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (child_p->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (child_p->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  this->try_cast = false;
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (&this->child);
  this_00 = DBConfig::GetConfig(context);
  this_01 = DBConfig::GetCastFunctions(this_00);
  local_30.query_location.index = 0xffffffffffffffff;
  local_30.context.ptr = context;
  CastFunctionSet::GetCastFunction
            (&this->bound_cast,this_01,&pEVar1->return_type,&(this->super_Expression).return_type,
             &local_30);
  return;
}

Assistant:

BoundCastExpression::BoundCastExpression(ClientContext &context, unique_ptr<Expression> child_p,
                                         LogicalType target_type_p)
    : Expression(ExpressionType::OPERATOR_CAST, ExpressionClass::BOUND_CAST, std::move(target_type_p)),
      child(std::move(child_p)), try_cast(false),
      bound_cast(BindCastFunction(context, child->return_type, return_type)) {
}